

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

int32_t mpack_node_i32(mpack_node_t node)

{
  anon_union_8_7_c87e5bf0_for_value aVar1;
  mpack_node_data_t *pmVar2;
  
  pmVar2 = node.data;
  if ((node.tree)->error != mpack_ok) {
    return 0;
  }
  if (pmVar2->type == mpack_type_int) {
    aVar1 = pmVar2->value;
    if ((int)aVar1.f != aVar1.i) goto LAB_00104a52;
  }
  else if ((pmVar2->type != mpack_type_uint) || (aVar1 = pmVar2->value, 0x7fffffff < aVar1.u)) {
LAB_00104a52:
    mpack_tree_flag_error(node.tree,mpack_error_type);
    return 0;
  }
  return (int32_t)aVar1.f;
}

Assistant:

MPACK_INLINE int32_t mpack_node_i32(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= INT32_MAX)
            return (int32_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= INT32_MIN && node.data->value.i <= INT32_MAX)
            return (int32_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}